

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O3

void __thiscall skiwi::anon_unknown_23::compile_fixture::build_apply(compile_fixture *this)

{
  char cVar1;
  fun_ptr f;
  uint64_t size;
  logic_error e;
  asmcode code;
  _func_unsigned_long_void_ptr_varargs *local_c8;
  ulong local_c0;
  first_pass_data local_b8;
  asmcode local_48 [48];
  
  assembler::asmcode::asmcode(local_48);
  cVar1 = skiwi::load_apply((shared_ptr *)&this->env,&this->rd,&this->md,&this->ctxt,local_48,
                            (map *)&this->pm,&this->ops);
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Cannot load apply\n",0x12);
  }
  else {
    local_b8.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_b8.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header;
    local_b8.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_b8.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    local_b8.size = 0;
    local_b8.data_size = 0;
    local_b8.label_to_address._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_b8.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_b8.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header;
    local_b8.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_b8.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    local_b8.external_to_address._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_b8.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_b8.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_b8.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_b8.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_c8 = (_func_unsigned_long_void_ptr_varargs *)
               assembler::assemble(&local_c0,&local_b8,local_48);
    (*local_c8)(&this->ctxt);
    std::
    vector<std::pair<unsigned_long(*)(void*,...),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,...),unsigned_long>>>
    ::emplace_back<unsigned_long(*&)(void*,___),unsigned_long&>
              ((vector<std::pair<unsigned_long(*)(void*,___),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,___),unsigned_long>>>
                *)&this->compiled_functions,&local_c8,&local_c0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::~_Rb_tree(&local_b8.external_to_address._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::~_Rb_tree(&local_b8.label_to_address._M_t);
  }
  assembler::asmcode::~asmcode(local_48);
  return;
}

Assistant:

void build_apply()
      {
      asmcode code;
      try
        {
        if (load_apply(env, rd, md, ctxt, code, pm, ops))
          {
          digest_asmcode(code);
          first_pass_data d;
          uint64_t size;
          fun_ptr f = (fun_ptr)assemble(size, d, code);
          f(&ctxt);
          compiled_functions.emplace_back(f, size);
          }
        else
          std::cout << "Cannot load apply\n";
        }
      catch (std::logic_error e)
        {
        std::cout << e.what() << " while compiling apply library\n\n";
        }
      }